

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileExecutableTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmMakefileExecutableTargetGenerator::cmMakefileExecutableTargetGenerator
          (cmMakefileExecutableTargetGenerator *this,cmGeneratorTarget *target)

{
  cmGeneratorTarget *this_00;
  pointer this_01;
  unique_ptr<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_> *this_02;
  unique_ptr<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_> local_150 [3];
  string local_138;
  Names local_118;
  cmGeneratorTarget *local_18;
  cmGeneratorTarget *target_local;
  cmMakefileExecutableTargetGenerator *this_local;
  
  local_18 = target;
  target_local = (cmGeneratorTarget *)this;
  cmMakefileTargetGenerator::cmMakefileTargetGenerator
            (&this->super_cmMakefileTargetGenerator,target);
  (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
  _vptr_cmCommonTargetGenerator = (_func_int **)&PTR__cmMakefileExecutableTargetGenerator_01681de0;
  std::__cxx11::string::string((string *)&this->DeviceLinkObject);
  (this->super_cmMakefileTargetGenerator).CustomCommandDriver = OnDepends;
  this_00 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  cmMakefileTargetGenerator::GetConfigName_abi_cxx11_
            (&local_138,&this->super_cmMakefileTargetGenerator);
  cmGeneratorTarget::GetExecutableNames(&local_118,this_00,&local_138);
  cmGeneratorTarget::Names::operator=
            (&(this->super_cmMakefileTargetGenerator).TargetNames,&local_118);
  cmGeneratorTarget::Names::~Names(&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::make_unique<cmOSXBundleGenerator,cmGeneratorTarget*&>((cmGeneratorTarget **)local_150);
  this_02 = &(this->super_cmMakefileTargetGenerator).OSXBundleGenerator;
  std::unique_ptr<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>::operator=
            (this_02,local_150);
  std::unique_ptr<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>::~unique_ptr
            (local_150);
  this_01 = std::unique_ptr<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>::
            operator->(this_02);
  cmOSXBundleGenerator::SetMacContentFolders
            (this_01,&(this->super_cmMakefileTargetGenerator).MacContentFolders);
  return;
}

Assistant:

cmMakefileExecutableTargetGenerator::cmMakefileExecutableTargetGenerator(
  cmGeneratorTarget* target)
  : cmMakefileTargetGenerator(target)
{
  this->CustomCommandDriver = OnDepends;
  this->TargetNames =
    this->GeneratorTarget->GetExecutableNames(this->GetConfigName());

  this->OSXBundleGenerator = cm::make_unique<cmOSXBundleGenerator>(target);
  this->OSXBundleGenerator->SetMacContentFolders(&this->MacContentFolders);
}